

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

void __thiscall Fl_Function_Type::write_code1(Fl_Function_Type *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int local_888;
  int local_884;
  int plevel_1;
  int nc_1;
  int skipc_1;
  int skips_1;
  char *nptr_1;
  char *sptr_1;
  char s_1 [1024];
  int plevel;
  int nc;
  int skipc;
  int skips;
  char *nptr;
  char *sptr;
  char s [1024];
  size_t n;
  char *k;
  int is_virtual;
  int is_static;
  char *star;
  char *rtype;
  Fl_Type *pFStack_18;
  char havechildren;
  Fl_Type *child;
  Fl_Function_Type *this_local;
  
  this->constructor = '\0';
  this->havewidgets = '\0';
  bVar1 = false;
  pFStack_18 = (this->super_Fl_Type).next;
  while( true ) {
    bVar5 = false;
    if (pFStack_18 != (Fl_Type *)0x0) {
      bVar5 = (this->super_Fl_Type).level < pFStack_18->level;
    }
    if (!bVar5) goto LAB_00186a7f;
    bVar1 = true;
    iVar2 = (*pFStack_18->_vptr_Fl_Type[0x17])();
    if (iVar2 != 0) break;
    pFStack_18 = pFStack_18->next;
  }
  this->havewidgets = '\x01';
LAB_00186a7f:
  if (bVar1) {
    write_c("\n");
  }
  iVar2 = ismain(this);
  if (iVar2 == 0) {
    star = this->return_type;
    _is_virtual = "";
    bVar5 = false;
    bVar6 = false;
    if (star != (char *)0x0) {
      iVar2 = strcmp(star,"static");
      if (iVar2 == 0) {
        bVar5 = true;
        star = (char *)0x0;
      }
      else {
        iVar2 = strncmp(star,"static ",7);
        bVar5 = iVar2 == 0;
        if (bVar5) {
          star = star + 7;
        }
      }
      iVar2 = strcmp(star,"virtual");
      if (iVar2 == 0) {
        bVar6 = true;
        star = (char *)0x0;
      }
      else {
        iVar2 = strncmp(star,"virtual ",8);
        bVar6 = iVar2 == 0;
        if (bVar6) {
          star = star + 8;
        }
      }
    }
    if (star == (char *)0x0) {
      if (this->havewidgets == '\0') {
        star = "void";
      }
      else {
        star = subclassname(pFStack_18);
        _is_virtual = "*";
      }
    }
    pcVar4 = Fl_Type::class_name(&this->super_Fl_Type,0);
    if (pcVar4 == (char *)0x0) {
      if (bVar1) {
        Fl_Type::write_comment_c(&this->super_Fl_Type,"");
      }
      if (this->public_ == '\0') {
        if (bVar1) {
          write_c("static ");
        }
      }
      else if (this->cdecl_ == '\0') {
        Fl_Type::name(&this->super_Fl_Type);
        write_h("%s%s %s;\n",star,_is_virtual);
      }
      else {
        Fl_Type::name(&this->super_Fl_Type);
        write_h("extern \"C\" { %s%s %s; }\n",star,_is_virtual);
      }
      bVar5 = false;
      bVar6 = false;
      local_884 = 0;
      local_888 = 0;
      nptr_1 = (char *)&sptr_1;
      for (_skipc_1 = Fl_Type::name(&this->super_Fl_Type); *_skipc_1 != '\0';
          _skipc_1 = _skipc_1 + 1) {
        if ((bVar5) || (*_skipc_1 != '(')) {
          if ((!bVar5) && (*_skipc_1 == ')')) {
            local_888 = local_888 + -1;
          }
        }
        else {
          local_888 = local_888 + 1;
        }
        if ((*_skipc_1 == '\"') && ((local_884 == 0 || (_skipc_1[-1] != '\\')))) {
          bVar5 = !bVar5;
        }
        else if ((!bVar5) && ((*_skipc_1 == '\'' && ((local_884 == 0 || (_skipc_1[-1] != '\\'))))))
        {
          bVar6 = !bVar6;
        }
        pcVar4 = _skipc_1;
        if (((((!bVar5) && (!bVar6)) && (local_888 == 1)) && (*_skipc_1 == '=')) &&
           ((local_884 == 0 || (_skipc_1[-1] != '\'')))) {
          while( true ) {
            pcVar4 = _skipc_1 + 1;
            bVar7 = false;
            if (((_skipc_1[1] != '\0') && ((bVar7 = true, !bVar5 && (bVar7 = true, !bVar6)))) &&
               ((*pcVar4 == ',' || (bVar7 = true, *pcVar4 == ')')))) {
              bVar7 = local_888 != 1;
            }
            if (!bVar7) break;
            if ((*pcVar4 == '\"') && (*_skipc_1 != '\\')) {
              bVar5 = !bVar5;
            }
            else if ((!bVar5) && ((*pcVar4 == '\'' && (*_skipc_1 != '\\')))) {
              bVar6 = !bVar6;
            }
            _skipc_1 = pcVar4;
            if (((bVar5) || (bVar6)) || (*pcVar4 != '(')) {
              if ((!bVar5) && (*pcVar4 == ')')) {
                local_888 = local_888 + -1;
              }
            }
            else {
              local_888 = local_888 + 1;
            }
          }
        }
        _skipc_1 = pcVar4;
        if (nptr_1 < s_1 + 0x3f7) {
          *nptr_1 = *_skipc_1;
          nptr_1 = nptr_1 + 1;
        }
        local_884 = local_884 + 1;
      }
      *nptr_1 = '\0';
      if (bVar1) {
        write_c("%s%s %s {\n",star,_is_virtual,&sptr_1);
      }
    }
    else {
      if (bVar1) {
        Fl_Type::write_comment_c(&this->super_Fl_Type,"");
      }
      write_public((int)this->public_);
      pcVar3 = Fl_Type::name(&this->super_Fl_Type);
      if (*pcVar3 == '~') {
        this->constructor = '\x01';
      }
      else {
        s._1016_8_ = strlen(pcVar4);
        pcVar3 = Fl_Type::name(&this->super_Fl_Type);
        iVar2 = strncmp(pcVar3,pcVar4,s._1016_8_);
        if ((iVar2 == 0) &&
           (pcVar3 = Fl_Type::name(&this->super_Fl_Type), pcVar3[s._1016_8_] == '(')) {
          this->constructor = '\x01';
        }
      }
      write_h("  ");
      if (bVar5) {
        write_h("static ");
      }
      if (bVar6) {
        write_h("virtual ");
      }
      if ((this->constructor == '\0') && (write_h("%s%s ",star,_is_virtual), bVar1)) {
        write_c("%s%s ",star,_is_virtual);
      }
      _skipc = Fl_Type::name(&this->super_Fl_Type);
      nptr = (char *)&sptr;
      while (*_skipc != '\0') {
        if (*_skipc == ':') {
          if (_skipc[1] != ':') break;
          *nptr = *_skipc;
          _skipc = _skipc + 1;
          nptr = nptr + 1;
        }
        *nptr = *_skipc;
        _skipc = _skipc + 1;
        nptr = nptr + 1;
      }
      *nptr = '\0';
      write_h("%s;\n",&sptr);
      bVar5 = false;
      bVar6 = false;
      s_1[0x3fc] = '\0';
      s_1[0x3fd] = '\0';
      s_1[0x3fe] = '\0';
      s_1[0x3ff] = '\0';
      s_1[0x3f8] = '\0';
      s_1[0x3f9] = '\0';
      s_1[0x3fa] = '\0';
      s_1[0x3fb] = '\0';
      nptr = (char *)&sptr;
      for (_skipc = Fl_Type::name(&this->super_Fl_Type); *_skipc != '\0'; _skipc = _skipc + 1) {
        if ((bVar5) || (*_skipc != '(')) {
          if ((!bVar5) && (*_skipc == ')')) {
            s_1._1016_4_ = s_1._1016_4_ + -1;
          }
        }
        else {
          s_1._1016_4_ = s_1._1016_4_ + 1;
        }
        if ((*_skipc == '\"') && ((s_1._1020_4_ == 0 || (_skipc[-1] != '\\')))) {
          bVar5 = !bVar5;
        }
        else if ((!bVar5) && ((*_skipc == '\'' && ((s_1._1020_4_ == 0 || (_skipc[-1] != '\\')))))) {
          bVar6 = !bVar6;
        }
        pcVar3 = _skipc;
        if ((((!bVar5) && (!bVar6)) && (s_1._1016_4_ == 1)) &&
           ((*_skipc == '=' && ((s_1._1020_4_ == 0 || (_skipc[-1] != '\'')))))) {
          while( true ) {
            pcVar3 = _skipc + 1;
            bVar7 = false;
            if ((_skipc[1] != '\0') &&
               (((bVar7 = true, !bVar5 && (bVar7 = true, !bVar6)) &&
                ((*pcVar3 == ',' || (bVar7 = true, *pcVar3 == ')')))))) {
              bVar7 = s_1._1016_4_ != 1;
            }
            if (!bVar7) break;
            if ((*pcVar3 == '\"') && (*_skipc != '\\')) {
              bVar5 = !bVar5;
            }
            else if ((!bVar5) && ((*pcVar3 == '\'' && (*_skipc != '\\')))) {
              bVar6 = !bVar6;
            }
            _skipc = pcVar3;
            if (((bVar5) || (bVar6)) || (*pcVar3 != '(')) {
              if ((!bVar5) && (*pcVar3 == ')')) {
                s_1._1016_4_ = s_1._1016_4_ + -1;
              }
            }
            else {
              s_1._1016_4_ = s_1._1016_4_ + 1;
            }
          }
        }
        _skipc = pcVar3;
        if (nptr < s + 0x3f7) {
          *nptr = *_skipc;
          nptr = nptr + 1;
        }
        s_1._1020_4_ = s_1._1020_4_ + 1;
      }
      *nptr = '\0';
      if (bVar1) {
        write_c("%s::%s {\n",pcVar4,&sptr);
      }
    }
  }
  else if (bVar1) {
    write_c("int main(int argc, char **argv) {\n");
  }
  if ((this->havewidgets != '\0') && (pcVar4 = Fl_Type::name(pFStack_18), pcVar4 == (char *)0x0)) {
    pcVar4 = subclassname(pFStack_18);
    write_c("  %s* w;\n",pcVar4);
  }
  indentation = indentation + 2;
  return;
}

Assistant:

void Fl_Function_Type::write_code1() {
  constructor=0;
  havewidgets = 0;
  Fl_Type *child;
  // if the function has no children (hence no body), Fluid will not generate
  // the function either. This is great if you decide to implement that function
  // inside another module
  char havechildren = 0;
  for (child = next; child && child->level > level; child = child->next) {
    havechildren = 1;
    if (child->is_widget()) {
      havewidgets = 1;
      break;
    }
  }
  if (havechildren)
    write_c("\n");
  if (ismain()) {
    if (havechildren)
      write_c("int main(int argc, char **argv) {\n");
  } else {
    const char* rtype = return_type;
    const char* star = "";
    // from matt: let the user type "static " at the start of type
    // in order to declare a static method;
    int is_static = 0;
    int is_virtual = 0;
    if (rtype) {
      if (!strcmp(rtype,"static")) {is_static = 1; rtype = 0;}
      else if (!strncmp(rtype, "static ",7)) {is_static = 1; rtype += 7;}
      if (!strcmp(rtype, "virtual")) {is_virtual = 1; rtype = 0;}
      else if (!strncmp(rtype, "virtual ",8)) {is_virtual = 1; rtype += 8;}
    }
    if (!rtype) {
      if (havewidgets) {
        rtype = subclassname(child);
        star = "*";
      } else rtype = "void";
    }
    
    const char* k = class_name(0);
    if (k) {
      if (havechildren)
        write_comment_c();
      write_public(public_);
      if (name()[0] == '~')
        constructor = 1;
      else {
        size_t n = strlen(k);
        if (!strncmp(name(), k, n) && name()[n] == '(') constructor = 1;
      }
      write_h("  ");
      if (is_static) write_h("static ");
      if (is_virtual) write_h("virtual ");
      if (!constructor) {
        write_h("%s%s ", rtype, star);
        if (havechildren)
          write_c("%s%s ", rtype, star);
      }
      
      // if this is a subclass, only write_h() the part before the ':'
      char s[1024], *sptr = s;
      char *nptr = (char *)name();
      
      while (*nptr) {
        if (*nptr == ':') {
          if (nptr[1] != ':') break;
          // Copy extra ":" for "class::member"...
          *sptr++ = *nptr++;
        }	  
        *sptr++ = *nptr++;
      }
      *sptr = '\0';
      
      write_h("%s;\n", s);
      // skip all function default param. init in body:
      int skips=0,skipc=0;
      int nc=0,plevel=0;
      for (sptr=s,nptr=(char*)name(); *nptr; nc++,nptr++) {
        if (!skips && *nptr=='(') plevel++;
        else if (!skips && *nptr==')') plevel--;
        if ( *nptr=='"' &&  !(nc &&  *(nptr-1)=='\\') ) 
          skips = skips ? 0 : 1;
        else if(!skips && *nptr=='\'' &&  !(nc &&  *(nptr-1)=='\\'))
          skipc = skipc ? 0 : 1;
        if(!skips && !skipc && plevel==1 && *nptr =='=' && 
           !(nc && *(nptr-1)=='\'') ) // ignore '=' case 
          while(*++nptr  && (skips || skipc || ( (*nptr!=',' && *nptr!=')') || plevel!=1) )) {
            if ( *nptr=='"' &&  *(nptr-1)!='\\' ) 
              skips = skips ? 0 : 1;
            else if(!skips && *nptr=='\'' &&  *(nptr-1)!='\\')
              skipc = skipc ? 0 : 1;
            if (!skips && !skipc && *nptr=='(') plevel++;
            else if (!skips && *nptr==')') plevel--;
          }
        
        if (sptr < (s + sizeof(s) - 1))	*sptr++ = *nptr;
      }
      *sptr = '\0';
      
      if (havechildren)
        write_c("%s::%s {\n", k, s);
    } else {
      if (havechildren)
        write_comment_c();
      if (public_) {
        if (cdecl_)
          write_h("extern \"C\" { %s%s %s; }\n", rtype, star, name());
        else
          write_h("%s%s %s;\n", rtype, star, name());
      } else {
        if (havechildren)
          write_c("static ");
      }
      
      // write everything but the default parameters (if any)
      char s[1024], *sptr;
      char *nptr;
      int skips=0,skipc=0;
      int nc=0,plevel=0;
      for (sptr=s,nptr=(char*)name(); *nptr; nc++,nptr++) {
        if (!skips && *nptr=='(') plevel++;
        else if (!skips && *nptr==')') plevel--;
        if ( *nptr=='"' &&  !(nc &&  *(nptr-1)=='\\') ) 
          skips = skips ? 0 : 1;
        else if(!skips && *nptr=='\'' &&  !(nc &&  *(nptr-1)=='\\'))
          skipc = skipc ? 0 : 1;
        if(!skips && !skipc && plevel==1 && *nptr =='=' && 
           !(nc && *(nptr-1)=='\'') ) // ignore '=' case 
          while(*++nptr  && (skips || skipc || ( (*nptr!=',' && *nptr!=')') || plevel!=1) )) {
            if ( *nptr=='"' &&  *(nptr-1)!='\\' ) 
              skips = skips ? 0 : 1;
            else if(!skips && *nptr=='\'' &&  *(nptr-1)!='\\')
              skipc = skipc ? 0 : 1;
            if (!skips && !skipc && *nptr=='(') plevel++;
            else if (!skips && *nptr==')') plevel--;
          }
        
        if (sptr < (s + sizeof(s) - 1))	*sptr++ = *nptr;
      }
      *sptr = '\0';
      
      if (havechildren)
        write_c("%s%s %s {\n", rtype, star, s);
    }
  }
  
  if (havewidgets && !child->name()) write_c("  %s* w;\n", subclassname(child));
  indentation += 2;
}